

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O2

void ncnn::conv3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  void *pvVar26;
  void *pvVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  void *pvVar31;
  void *pvVar32;
  int remain_1;
  long lVar33;
  int remain;
  int iVar34;
  long lVar35;
  void *pvVar36;
  ulong uVar37;
  void *pvVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  Mat out;
  Mat local_b0;
  Mat local_70;
  
  lVar22 = (long)bottom_blob->w;
  uVar8 = bottom_blob->c;
  iVar9 = top_blob->w;
  iVar10 = top_blob->h;
  pvVar11 = _kernel->data;
  pvVar12 = _bias->data;
  lVar25 = (long)iVar9;
  uVar37 = 0;
  uVar30 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar30 = uVar37;
  }
  uVar29 = (ulong)(uint)top_blob->c;
  if (top_blob->c < 1) {
    uVar29 = uVar37;
  }
  lVar35 = (long)(bottom_blob->w + 2) * 4;
  for (; uVar37 != uVar29; uVar37 = uVar37 + 1) {
    Mat::channel(&local_70,top_blob,(int)uVar37);
    if (pvVar12 == (void *)0x0) {
      fVar39 = 0.0;
    }
    else {
      fVar39 = *(float *)((long)pvVar12 + uVar37 * 4);
    }
    Mat::fill(&local_70,fVar39);
    iVar21 = uVar8 * 9 * (int)uVar37;
    for (uVar24 = 0; pvVar31 = local_70.data, uVar24 != uVar30; uVar24 = uVar24 + 1) {
      Mat::channel(&local_b0,bottom_blob,(int)uVar24);
      pvVar38 = local_b0.data;
      Mat::~Mat(&local_b0);
      lVar23 = uVar24 * 0x24;
      pvVar26 = (void *)((long)pvVar38 + lVar22 * 4);
      pvVar27 = (void *)((long)pvVar38 + lVar22 * 8);
      pvVar32 = (void *)((long)pvVar38 + lVar22 * 0xc);
      pvVar36 = pvVar31;
      for (uVar28 = 0; (int)(uVar28 | 1) < iVar10; uVar28 = uVar28 + 2) {
        lVar33 = 0;
        for (iVar34 = iVar9; 0 < iVar34; iVar34 = iVar34 + -1) {
          uVar6 = *(undefined8 *)((long)pvVar38 + lVar33 + 4);
          uVar7 = *(undefined8 *)((long)pvVar26 + lVar33 + 4);
          pfVar1 = (float *)((long)pvVar11 + lVar23 + (long)iVar21 * 4);
          fVar13 = *pfVar1;
          fVar14 = pfVar1[1];
          fVar15 = pfVar1[2];
          fVar16 = pfVar1[3];
          pfVar1 = (float *)((long)pvVar11 + lVar23 + (long)iVar21 * 4 + 0x10);
          fVar17 = *pfVar1;
          fVar18 = pfVar1[1];
          fVar19 = pfVar1[2];
          fVar20 = pfVar1[3];
          fVar39 = *(float *)((long)pvVar26 + lVar33);
          fVar42 = (float)uVar7;
          fVar43 = (float)((ulong)uVar7 >> 0x20);
          fVar40 = (float)*(undefined8 *)((long)pvVar27 + lVar33);
          fVar41 = (float)((ulong)*(undefined8 *)((long)pvVar27 + lVar33) >> 0x20);
          fVar3 = *(float *)((long)pvVar27 + lVar33 + 8);
          fVar4 = *(float *)((long)pvVar11 + lVar23 + (long)iVar21 * 4 + 0x20);
          uVar7 = *(undefined8 *)((long)pvVar32 + lVar33);
          fVar5 = *(float *)((long)pvVar32 + lVar33 + 8);
          *(float *)((long)pvVar31 + lVar33) =
               fVar41 * fVar20 + fVar39 * fVar16 + fVar43 * fVar18 + (float)uVar6 * fVar14 +
               fVar40 * fVar19 + (float)((ulong)uVar6 >> 0x20) * fVar15 +
               fVar42 * fVar17 + *(float *)((long)pvVar38 + lVar33) * fVar13 + fVar4 * fVar3 +
               *(float *)((long)pvVar31 + lVar33);
          *(float *)((long)pvVar36 + lVar33 + lVar25 * 4) =
               (float)((ulong)uVar7 >> 0x20) * fVar20 + fVar40 * fVar16 +
               fVar3 * fVar18 + fVar13 * fVar39 +
               (float)uVar7 * fVar19 + fVar43 * fVar15 + fVar41 * fVar17 + fVar14 * fVar42 +
               fVar4 * fVar5 + *(float *)((long)pvVar36 + lVar33 + lVar25 * 4);
          lVar33 = lVar33 + 4;
        }
        pvVar38 = (void *)((long)pvVar38 + lVar33 + lVar35);
        pvVar26 = (void *)((long)pvVar26 + lVar33 + lVar35);
        pvVar27 = (void *)((long)pvVar27 + lVar33 + lVar35);
        pvVar32 = (void *)((long)pvVar32 + lVar33 + lVar35);
        pvVar31 = (void *)((long)pvVar31 + lVar33 + lVar25 * 4);
        pvVar36 = (void *)((long)pvVar36 + lVar33 + lVar25 * 4);
      }
      for (; (int)uVar28 < iVar10; uVar28 = uVar28 + 1) {
        lVar33 = 0;
        for (iVar34 = iVar9; 0 < iVar34; iVar34 = iVar34 + -1) {
          uVar6 = *(undefined8 *)((long)pvVar38 + lVar33 + 4);
          pfVar2 = (float *)((long)pvVar11 + lVar23 + (long)iVar21 * 4);
          pfVar1 = (float *)((long)pvVar11 + lVar23 + (long)iVar21 * 4 + 0x10);
          uVar7 = *(undefined8 *)((long)pvVar26 + lVar33 + 4);
          *(float *)((long)pvVar31 + lVar33) =
               (float)((ulong)*(undefined8 *)((long)pvVar27 + lVar33) >> 0x20) * pfVar1[3] +
               *(float *)((long)pvVar26 + lVar33) * pfVar2[3] +
               (float)((ulong)uVar7 >> 0x20) * pfVar1[1] + (float)uVar6 * pfVar2[1] +
               (float)*(undefined8 *)((long)pvVar27 + lVar33) * pfVar1[2] +
               (float)((ulong)uVar6 >> 0x20) * pfVar2[2] +
               (float)uVar7 * *pfVar1 + *(float *)((long)pvVar38 + lVar33) * *pfVar2 +
               *(float *)((long)pvVar11 + lVar23 + (long)iVar21 * 4 + 0x20) *
               *(float *)((long)pvVar27 + lVar33 + 8) + *(float *)((long)pvVar31 + lVar33);
          lVar33 = lVar33 + 4;
        }
        pvVar38 = (void *)((long)pvVar38 + lVar33 + 8);
        pvVar26 = (void *)((long)pvVar26 + lVar33 + 8);
        pvVar27 = (void *)((long)pvVar27 + lVar33 + 8);
        pvVar31 = (void *)((long)pvVar31 + lVar33);
      }
    }
    Mat::~Mat(&local_70);
  }
  return;
}

Assistant:

static void conv3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q=0; q<inch; q++)
        {
            float* outptr = out;
            float* outptr2 = outptr + outw;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float* r0 = img0;
            const float* r1 = img0 + w;
            const float* r2 = img0 + w*2;
            const float* r3 = img0 + w*3;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            int i = 0;

            for (; i+1 < outh; i+=2)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;
                    float sum2 = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    sum2 += r1[0] * k0[0];
                    sum2 += r1[1] * k0[1];
                    sum2 += r1[2] * k0[2];
                    sum2 += r2[0] * k1[0];
                    sum2 += r2[1] * k1[1];
                    sum2 += r2[2] * k1[2];
                    sum2 += r3[0] * k2[0];
                    sum2 += r3[1] * k2[1];
                    sum2 += r3[2] * k2[2];

                    *outptr += sum;
                    *outptr2 += sum2;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    outptr++;
                    outptr2++;
                }

                r0 += 2 + w;
                r1 += 2 + w;
                r2 += 2 + w;
                r3 += 2 + w;

                outptr += outw;
                outptr2 += outw;
            }

            for (; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0++;
                    r1++;
                    r2++;
                    outptr++;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

        }
    }

}